

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CombLoops.cpp
# Opt level: O3

void __thiscall
StrongConnectedComponents::makeAdjListSubgraph(StrongConnectedComponents *this,int node)

{
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *this_00;
  vector<int,std::allocator<int>> *this_01;
  pointer pvVar1;
  iterator __position;
  int iVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  int currentNode;
  int local_44;
  long local_40;
  long local_38;
  
  this_00 = &this->adjList;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::_M_erase_at_end(this_00,(this->adjList).
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
  local_40 = ((long)(this->adjListOriginal->
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->adjListOriginal->
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  iVar2 = (int)local_40;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(this_00,(long)iVar2);
  if (node < iVar2) {
    lVar3 = (long)node;
    do {
      pvVar1 = (this->adjListOriginal->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar4 = (uint)((ulong)((long)*(pointer *)
                                    ((long)&pvVar1[lVar3].
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl +
                                    8) -
                            *(long *)&pvVar1[lVar3].super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl) >> 2);
      local_38 = lVar3;
      if (0 < (int)uVar4) {
        uVar5 = 0;
        do {
          local_44 = *(int *)(*(long *)&(this->adjListOriginal->
                                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start[lVar3].
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl +
                             uVar5 * 4);
          if (node <= local_44) {
            this_01 = (vector<int,std::allocator<int>> *)
                      ((this_00->
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + lVar3);
            __position._M_current = *(int **)(this_01 + 8);
            if (__position._M_current == *(int **)(this_01 + 0x10)) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (this_01,__position,&local_44);
            }
            else {
              *__position._M_current = local_44;
              *(int **)(this_01 + 8) = __position._M_current + 1;
            }
          }
          uVar5 = uVar5 + 1;
        } while ((uVar4 & 0x7fffffff) != uVar5);
      }
      lVar3 = local_38 + 1;
    } while ((int)lVar3 != (int)local_40);
  }
  return;
}

Assistant:

void StrongConnectedComponents::makeAdjListSubgraph(const int node) {
    adjList.clear();
    const int adjListSize = adjListOriginal.size();
    adjList.resize(adjListSize);

    for (int i = node; i < adjListSize; i++) {
        const int adjListOriginalISize = adjListOriginal[i].size();
        for (int j = 0; j < adjListOriginalISize; j++) {
            const int currentNode = adjListOriginal[i][j];
            if (currentNode >= node) {
                adjList[i].push_back(currentNode);
            }
        }
    }
}